

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_formats.c
# Opt level: O3

CMFormat INT_CMregister_simple_format
                   (CManager cm,char *format_name,FMFieldList field_list,int struct_size)

{
  FMStructDescList format_list;
  CMFormat p_Var1;
  
  format_list = (FMStructDescList)INT_CMmalloc(0x40);
  format_list->format_name = format_name;
  format_list->field_list = field_list;
  format_list->struct_size = struct_size;
  format_list[1].opt_info = (FMOptInfo *)0x0;
  format_list->opt_info = (FMOptInfo *)0x0;
  format_list[1].format_name = (char *)0x0;
  *(undefined8 *)((long)&format_list[1].format_name + 4) = 0;
  *(undefined8 *)((long)&format_list[1].field_list + 4) = 0;
  p_Var1 = INT_CMregister_format(cm,format_list);
  return p_Var1;
}

Assistant:

CMFormat
INT_CMregister_simple_format(CManager cm, char *format_name, FMFieldList field_list, int struct_size)
{
  FMStructDescRec *format_list = malloc(sizeof(*format_list) * 2);
  /* NOTE:  This is a memory leak as we do not, by design, deallocate the format_list */
  format_list[0].format_name = format_name;
  format_list[0].field_list = field_list;
  format_list[0].struct_size = struct_size;
  format_list[0].opt_info = NULL;
  format_list[1].format_name = NULL;
  format_list[1].field_list = NULL;
  format_list[1].struct_size = 0;
  format_list[1].opt_info = NULL;
  return INT_CMregister_format(cm, &format_list[0]);
}